

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

MidiFile * __thiscall smf::MidiFile::operator=(MidiFile *this,MidiFile *other)

{
  size_type sVar1;
  back_insert_iterator<std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>_>
  __first;
  MidiEventList **local_28;
  const_iterator it;
  MidiFile *other_local;
  MidiFile *this_local;
  
  if (this != other) {
    it._M_current = (MidiEventList **)other;
    sVar1 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::size
                      (&other->m_events);
    std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::reserve
              (&this->m_events,sVar1);
    local_28 = (MidiEventList **)
               std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::begin
                         (it._M_current);
    __first = std::
              back_inserter<std::vector<smf::MidiEventList*,std::allocator<smf::MidiEventList*>>>
                        (&this->m_events);
    sVar1 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::size
                      ((vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_> *)
                       it._M_current);
    std::operator=(__first,sVar1,(const_iterator *)&local_28);
    this->m_ticksPerQuarterNote = *(int *)(it._M_current + 3);
    this->m_trackCount = *(int *)((long)it._M_current + 0x1c);
    this->m_theTrackState = *(int *)(it._M_current + 4);
    this->m_theTimeState = *(int *)((long)it._M_current + 0x24);
    std::__cxx11::string::operator=((string *)&this->m_readFileName,(string *)(it._M_current + 5));
    this->m_timemapvalid = (bool)(*(byte *)(it._M_current + 9) & 1);
    std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator=
              (&this->m_timemap,
               (vector<smf::_TickTime,_std::allocator<smf::_TickTime>_> *)(it._M_current + 10));
    this->m_rwstatus = (bool)(*(byte *)(it._M_current + 0xd) & 1);
    if ((*(byte *)((long)it._M_current + 0x69) & 1) != 0) {
      linkEventPairs(this);
    }
  }
  return this;
}

Assistant:

MidiFile& MidiFile::operator=(const MidiFile& other) {
	if (this == &other) {
		return *this;
	}
	m_events.reserve(other.m_events.size());
	auto it = other.m_events.begin();
	std::generate_n(std::back_inserter(m_events), other.m_events.size(),
		[&]()->MidiEventList* {
			return new MidiEventList(**it++);
		}
	);
	m_ticksPerQuarterNote = other.m_ticksPerQuarterNote;
	m_trackCount          = other.m_trackCount;
	m_theTrackState       = other.m_theTrackState;
	m_theTimeState        = other.m_theTimeState;
	m_readFileName        = other.m_readFileName;
	m_timemapvalid        = other.m_timemapvalid;
	m_timemap             = other.m_timemap;
	m_rwstatus            = other.m_rwstatus;
	if (other.m_linkedEventsQ) {
		linkEventPairs();
	}
	return *this;
}